

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsip.cpp
# Opt level: O2

bool __thiscall tsip::open_gps_port(tsip *this,string *port)

{
  bool bVar1;
  FILE *file;
  tsip *this_00;
  string local_40 [32];
  
  bVar1 = std::operator==(port,"");
  if (bVar1) {
    std::__cxx11::string::_M_assign((string *)port);
  }
  bVar1 = std::operator==(port,"");
  if (bVar1) {
    puts("Port must be provided in call or in set_gps_port");
    bVar1 = false;
  }
  else {
    std::__cxx11::string::string(local_40,(string *)port);
    std::__cxx11::string::_M_assign((string *)&this->gps_port);
    std::__cxx11::string::~string(local_40);
    this_00 = (tsip *)(this->gps_port)._M_dataplus._M_p;
    file = fopen((char *)this_00,"r");
    this->file = (FILE *)file;
    if (file == (FILE *)0x0) {
      bVar1 = false;
      printf("Cannot open %s\n",(this->gps_port)._M_dataplus._M_p);
      perror((this->gps_port)._M_dataplus._M_p);
      this->port_status = false;
    }
    else {
      setup_gps_port(this_00,(FILE *)file);
      this->port_status = true;
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool tsip::open_gps_port(std::string port)
{
	if (port == "") {
		port = gps_port;
	}
	if (port == "") {
		printf("Port must be provided in call or in set_gps_port\n");
		return(false);
	}

	// set the port
	set_gps_port(port);

    file = fopen(gps_port.c_str(), "r");

	if (file != NULL) {
		setup_gps_port(file);
		port_status = true;
		return(true);
	} else {
		printf("Cannot open %s\n", gps_port.c_str());
		perror(gps_port.c_str());
		port_status = false;
        return (false);
	}
    //if(!file) {
		////if open fails - terminate run
        //printf("Cannot open %s\n", gps_port.c_str());
        //return (false);
    //}
	//printf("calling setup\n");
    //setup_gps_port(file);
    //printf("return from setup\n");
    //return(true);
}